

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int buffer_push_encrypted_records
              (ptls_buffer_t *buf,uint8_t type,uint8_t *src,size_t len,
              st_ptls_traffic_protection_t *enc)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  ulong local_78;
  size_t body_size;
  uint8_t aad [13];
  uint64_t nonce;
  size_t body_start;
  size_t capacity;
  st_ptls_traffic_protection_t *local_40;
  size_t chunk_size;
  st_ptls_traffic_protection_t *psStack_30;
  int ret;
  st_ptls_traffic_protection_t *enc_local;
  size_t len_local;
  uint8_t *src_local;
  ptls_buffer_t *ppStack_10;
  uint8_t type_local;
  ptls_buffer_t *buf_local;
  
  chunk_size._4_4_ = 0;
  psStack_30 = enc;
  enc_local = (st_ptls_traffic_protection_t *)len;
  len_local = (size_t)src;
  src_local._7_1_ = type;
  ppStack_10 = buf;
  do {
    if (enc_local == (st_ptls_traffic_protection_t *)0x0) {
      return chunk_size._4_4_;
    }
    local_40 = enc_local;
    if ((st_ptls_traffic_protection_t *)0x4000 < enc_local) {
      local_40 = (st_ptls_traffic_protection_t *)0x4000;
    }
    if ((psStack_30->field_0x58 & 1) == 0) {
      capacity_1._5_1_ = 0x17;
      capacity_1._6_1_ = 3;
      capacity_1._7_1_ = 3;
      chunk_size._4_4_ = ptls_buffer__do_pushv(ppStack_10,(void *)((long)&capacity_1 + 5),3);
      if (chunk_size._4_4_ != 0) {
        return chunk_size._4_4_;
      }
      body_start_1 = 2;
      chunk_size._4_4_ = ptls_buffer__do_pushv(ppStack_10,"",2);
      if (chunk_size._4_4_ != 0) {
        return chunk_size._4_4_;
      }
      sVar1 = ppStack_10->off;
      chunk_size._4_4_ =
           ptls_buffer_reserve_aligned
                     (ppStack_10,(size_t)(local_40->secret + psStack_30->aead->algo->tag_size + 1),
                      psStack_30->aead->algo->align_bits);
      if (chunk_size._4_4_ != 0) {
        return chunk_size._4_4_;
      }
      sVar2 = aead_encrypt(psStack_30,ppStack_10->base + ppStack_10->off,(void *)len_local,
                           (size_t)local_40,src_local._7_1_);
      ppStack_10->off = sVar2 + ppStack_10->off;
      uVar3 = ppStack_10->off - sVar1;
      if (0xffff < uVar3) {
        return 0x20c;
      }
      for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
        ppStack_10->base[sVar1 - body_start_1] =
             (uint8_t)(uVar3 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
      }
    }
    else {
      capacity._5_1_ = src_local._7_1_;
      capacity._6_1_ = 3;
      capacity._7_1_ = 3;
      chunk_size._4_4_ = ptls_buffer__do_pushv(ppStack_10,(void *)((long)&capacity + 5),3);
      if (chunk_size._4_4_ != 0) {
        return chunk_size._4_4_;
      }
      body_start = 2;
      chunk_size._4_4_ = ptls_buffer__do_pushv(ppStack_10,"",2);
      if (chunk_size._4_4_ != 0) {
        return chunk_size._4_4_;
      }
      sVar1 = ppStack_10->off;
      chunk_size._4_4_ =
           ptls_buffer_reserve_aligned
                     (ppStack_10,
                      (size_t)(local_40->secret +
                              psStack_30->aead->algo->tag_size +
                              (psStack_30->aead->algo->tls12).record_iv_size),
                      psStack_30->aead->algo->align_bits);
      if (chunk_size._4_4_ != 0) {
        return chunk_size._4_4_;
      }
      if ((psStack_30->aead->algo->tls12).record_iv_size == 0) {
        aad._5_8_ = psStack_30->seq;
      }
      else {
        if ((psStack_30->aead->algo->tls12).record_iv_size != 8) {
          __assert_fail("enc->aead->algo->tls12.record_iv_size == 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                        ,0x30b,
                        "int buffer_push_encrypted_records(ptls_buffer_t *, uint8_t, const uint8_t *, size_t, struct st_ptls_traffic_protection_t *)"
                       );
        }
        aad._5_8_ = psStack_30->tls12_enc_record_iv;
        psStack_30->tls12_enc_record_iv = aad._5_8_ + 1;
        encode64(ppStack_10->base + ppStack_10->off,aad._5_8_);
        ppStack_10->off = ppStack_10->off + 8;
      }
      build_tls12_aad((uint8_t *)((long)&body_size + 3),src_local._7_1_,psStack_30->seq,
                      (uint16_t)local_40);
      sVar2 = ptls_aead_encrypt(psStack_30->aead,ppStack_10->base + ppStack_10->off,
                                (void *)len_local,(size_t)local_40,aad._5_8_,
                                (void *)((long)&body_size + 3),0xd);
      ppStack_10->off = sVar2 + ppStack_10->off;
      psStack_30->seq = psStack_30->seq + 1;
      local_78 = ppStack_10->off - sVar1;
      if (0xffff < local_78) {
        return 0x20c;
      }
      for (; body_start != 0; body_start = body_start - 1) {
        ppStack_10->base[sVar1 - body_start] =
             (uint8_t)(local_78 >> (((char)body_start + -1) * '\b' & 0x3fU));
      }
    }
    len_local = (size_t)(local_40->secret + len_local);
    enc_local = (st_ptls_traffic_protection_t *)((long)enc_local - (long)local_40);
  } while( true );
}

Assistant:

static int buffer_push_encrypted_records(ptls_buffer_t *buf, uint8_t type, const uint8_t *src, size_t len,
                                         struct st_ptls_traffic_protection_t *enc)
{
    int ret = 0;

    while (len != 0) {
        size_t chunk_size = len;
        if (chunk_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            chunk_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        if (enc->tls12) {
            buffer_push_record(buf, type, {
                /* reserve memory */
                if ((ret = ptls_buffer_reserve_aligned(
                         buf, enc->aead->algo->tls12.record_iv_size + chunk_size + enc->aead->algo->tag_size,
                         enc->aead->algo->align_bits)) != 0)
                    goto Exit;
                /* determine nonce, as well as prepending that walue as the record IV (AES-GCM) */
                uint64_t nonce;
                if (enc->aead->algo->tls12.record_iv_size != 0) {
                    assert(enc->aead->algo->tls12.record_iv_size == 8);
                    nonce = enc->tls12_enc_record_iv++;
                    encode64(buf->base + buf->off, nonce);
                    buf->off += 8;
                } else {
                    nonce = enc->seq;
                }
                /* build AAD */
                uint8_t aad[PTLS_TLS12_AAD_SIZE];
                build_tls12_aad(aad, type, enc->seq, (uint16_t)chunk_size);
                /* encrypt */
                buf->off += ptls_aead_encrypt(enc->aead, buf->base + buf->off, src, chunk_size, nonce, aad, sizeof(aad));
                ++enc->seq;
            });
        } else {
            buffer_push_record(buf, PTLS_CONTENT_TYPE_APPDATA, {
                if ((ret = ptls_buffer_reserve_aligned(buf, chunk_size + enc->aead->algo->tag_size + 1,
                                                       enc->aead->algo->align_bits)) != 0)
                    goto Exit;
                buf->off += aead_encrypt(enc, buf->base + buf->off, src, chunk_size, type);
            });
        }
        src += chunk_size;
        len -= chunk_size;
    }

Exit:
    return ret;
}